

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O2

SimpleStringMemoryBlock * __thiscall
SimpleStringInternalCache::allocateNewCacheBlockFrom
          (SimpleStringInternalCache *this,SimpleStringInternalCacheNode *node)

{
  SimpleStringMemoryBlock *pSVar1;
  
  pSVar1 = createSimpleStringMemoryBlock(this,node->size_,node->usedMemoryHead_);
  pSVar1->next_ = node->usedMemoryHead_;
  node->usedMemoryHead_ = pSVar1;
  return pSVar1;
}

Assistant:

SimpleStringMemoryBlock* SimpleStringInternalCache::allocateNewCacheBlockFrom(SimpleStringInternalCacheNode* node)
{
    SimpleStringMemoryBlock* block = createSimpleStringMemoryBlock(node->size_, node->usedMemoryHead_);
    node->usedMemoryHead_ = addToSimpleStringMemoryBlockList(block, node->usedMemoryHead_);
    return block;
}